

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O2

void __thiscall
validation_block_tests::witness_commitment_index::test_method(witness_commitment_index *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  long lVar1;
  CScript *pCVar2;
  Chainstate *chainstate;
  undefined8 uVar3;
  iterator pvVar4;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined4 local_270;
  int local_26c;
  char *local_268;
  char *local_260;
  undefined1 local_258 [56];
  char *local_220;
  CMutableTransaction txCoinbase;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> ptemplate;
  Options options;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  CTxOut invalid;
  CTxOut min_plus_one;
  CTxOut witness;
  CBlock pblock;
  CScript pubKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
             ,0x14a,"test_method","m_node.chainman");
  pvVar4 = (iterator)0x14a;
  pvVar5 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock22,&cs_main,"Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
             ,0x14a,false);
  pubKey.super_CScriptBase._union._16_8_ = 0;
  pubKey.super_CScriptBase._24_8_ = 0;
  pubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  pubKey.super_CScriptBase._union._8_8_ = 0;
  pCVar2 = CScript::push_int64(&pubKey,1);
  CScript::operator<<(pCVar2,OP_1);
  options.super_BlockCreateOptions.use_mempool = true;
  options.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  options.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  options.nBlockMaxWeight = 0x3cf960;
  options.blockMinFeeRate.nSatoshisPerK = 1000;
  options.test_block_validity = true;
  options.print_modified_fee = false;
  chainstate = ChainstateManager::ActiveChainstate
                         ((val->_M_t).
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)&pblock,chainstate,
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&options);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&ptemplate,(CScript *)&pblock);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)&pblock);
  CBlock::CBlock(&pblock,(CBlock *)
                         ptemplate._M_t.
                         super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                         .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl);
  CTxOut::CTxOut(&witness);
  pCVar2 = &witness.scriptPubKey;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&pCVar2->super_CScriptBase,0x26);
  uVar3 = pCVar2;
  if (0x1c < witness.scriptPubKey.super_CScriptBase._size) {
    uVar3 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  }
  (((CScript *)uVar3)->super_CScriptBase)._union.direct[0] = 'j';
  uVar3 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar3 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar3 + 1) = '$';
  uVar3 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar3 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar3 + 2) = -0x56;
  uVar3 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar3 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar3 + 3) = '!';
  uVar3 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar3 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar3 + 4) = -0x57;
  uVar3 = &witness.scriptPubKey.super_CScriptBase._union;
  if (0x1c < witness.scriptPubKey.super_CScriptBase._size) {
    uVar3 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  }
  *(char *)(uVar3 + 5) = -0x13;
  CTxOut::CTxOut(&min_plus_one,&witness);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            (&min_plus_one.scriptPubKey.super_CScriptBase,0x27);
  CTxOut::CTxOut(&invalid,&witness);
  uVar3 = &invalid.scriptPubKey;
  if (0x1c < invalid.scriptPubKey.super_CScriptBase._size) {
    uVar3 = invalid.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  }
  (((CScript *)uVar3)->super_CScriptBase)._union.direct[0] = 'i';
  CMutableTransaction::CMutableTransaction
            (&txCoinbase,
             ((pblock.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txCoinbase.vout,4);
  CTxOut::operator=(txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start,&witness);
  CTxOut::operator=(txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + 1,&witness);
  CTxOut::operator=(txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + 2,&min_plus_one);
  CTxOut::operator=(txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + 3,&invalid);
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)local_258);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pblock.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 8));
  local_258._48_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_220 = "";
  local_258._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_258._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x169;
  file.m_begin = local_258 + 0x30;
  msg.m_end = pvVar5;
  msg.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_258 + 0x20),
             msg);
  local_258[8] = 0;
  local_258._0_8_ = &PTR__lazy_ostream_011480b0;
  local_258._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_258._24_8_ = "";
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_260 = "";
  local_26c = GetWitnessCommitmentIndex(&pblock);
  local_270 = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_258,&local_268,0x169,1,2,&local_26c,"GetWitnessCommitmentIndex(pblock)",
             &local_270,"2");
  CMutableTransaction::~CMutableTransaction(&txCoinbase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&invalid.scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&min_plus_one.scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&pCVar2->super_CScriptBase);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&pblock.vtx);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&ptemplate);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&pubKey.super_CScriptBase);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(witness_commitment_index)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    CScript pubKey;
    pubKey << 1 << OP_TRUE;
    BlockAssembler::Options options;
    auto ptemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(pubKey);
    CBlock pblock = ptemplate->block;

    CTxOut witness;
    witness.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
    witness.scriptPubKey[0] = OP_RETURN;
    witness.scriptPubKey[1] = 0x24;
    witness.scriptPubKey[2] = 0xaa;
    witness.scriptPubKey[3] = 0x21;
    witness.scriptPubKey[4] = 0xa9;
    witness.scriptPubKey[5] = 0xed;

    // A witness larger than the minimum size is still valid
    CTxOut min_plus_one = witness;
    min_plus_one.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT + 1);

    CTxOut invalid = witness;
    invalid.scriptPubKey[0] = OP_VERIFY;

    CMutableTransaction txCoinbase(*pblock.vtx[0]);
    txCoinbase.vout.resize(4);
    txCoinbase.vout[0] = witness;
    txCoinbase.vout[1] = witness;
    txCoinbase.vout[2] = min_plus_one;
    txCoinbase.vout[3] = invalid;
    pblock.vtx[0] = MakeTransactionRef(std::move(txCoinbase));

    BOOST_CHECK_EQUAL(GetWitnessCommitmentIndex(pblock), 2);
}